

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

_Bool invalidPrefix(InternalInstruction *insn)

{
  uint uVar1;
  InternalInstruction *insn_local;
  
  if (insn->prefixPresent[0xf0] == '\0') {
    insn_local._7_1_ = false;
  }
  else {
    uVar1 = (uint)insn->instructionID;
    if ((((((uVar1 - 0x21 < 3) || (uVar1 - 0x2a < 3)) || (uVar1 - 0x33 < 3)) ||
         ((((((uVar1 - 0x3c < 2 || (uVar1 - 0x47 < 3)) ||
             ((uVar1 - 0x53 < 3 || ((uVar1 - 0x5f < 3 || (uVar1 - 0x6b < 2)))))) ||
            (uVar1 - 0xac < 3)) ||
           ((((uVar1 - 0xb5 < 3 || (uVar1 - 0xbe < 3)) || (uVar1 - 199 < 2)) ||
            ((uVar1 - 0x133 < 2 || (uVar1 - 0x137 < 2)))))) ||
          ((((uVar1 - 0x13b < 2 || ((uVar1 - 0x13f < 2 || (uVar1 - 0x143 < 2)))) ||
            (uVar1 - 0x147 < 2)) ||
           (((((uVar1 - 0x14b < 2 || (uVar1 - 0x14f < 2)) || (uVar1 - 0x153 < 2)) ||
             ((uVar1 == 0x23b || (uVar1 == 0x23d)))) ||
            (((uVar1 == 0x23f || ((uVar1 - 0x241 < 2 || (uVar1 == 0x28e)))) ||
             ((uVar1 == 0x292 || (((uVar1 == 0x294 || (uVar1 == 0x296)) || (uVar1 == 0x298))))))))))
          )))) || (((((uVar1 == 0x29a || (uVar1 == 0x380)) ||
                     ((uVar1 == 900 || ((uVar1 == 0x386 || (uVar1 == 0x388)))))) ||
                    ((uVar1 == 0x38a ||
                     (((((uVar1 == 0x38c || (uVar1 == 0x70e)) || (uVar1 == 0x710)) ||
                       ((uVar1 == 0x712 || (uVar1 == 0x714)))) ||
                      ((uVar1 == 0x736 || ((uVar1 == 0x738 || (uVar1 == 0x73a)))))))))) ||
                   (((uVar1 == 0x73c ||
                     (((uVar1 - 0x73f < 3 || (uVar1 - 0x748 < 4)) || (uVar1 - 0x752 < 3)))) ||
                    ((((uVar1 - 0x75b < 2 || (uVar1 - 0x9d0 < 3)) ||
                      ((uVar1 - 0x9d9 < 3 || ((uVar1 - 0x9e2 < 3 || (uVar1 - 0x9eb < 2)))))) ||
                     (uVar1 - 0xad3 < 3)))))))) ||
       ((((((uVar1 - 0xadc < 3 || (uVar1 - 0xae5 < 3)) || (uVar1 - 0xaee < 2)) ||
          (((uVar1 == 0x1829 || (uVar1 == 0x182b)) ||
           ((uVar1 == 0x182d || ((uVar1 == 0x182f || (uVar1 == 0x1834)))))))) || (uVar1 == 0x1838))
        || (((((uVar1 == 0x183b || (uVar1 == 0x183d)) || (uVar1 - 0x1849 < 3)) ||
             ((uVar1 - 0x1852 < 3 || (uVar1 - 0x185b < 3)))) || (uVar1 - 0x1864 < 2)))))) {
      insn_local._7_1_ = false;
    }
    else {
      insn_local._7_1_ = true;
    }
  }
  return insn_local._7_1_;
}

Assistant:

static bool invalidPrefix(struct InternalInstruction *insn)
{
	// LOCK prefix
	if (insn->prefixPresent[0xf0]) {
		switch(insn->instructionID) {
			default:
				// invalid LOCK
				return true;

			// DEC
			case X86_DEC16m:
			case X86_DEC32m:
			case X86_DEC64_16m:
			case X86_DEC64_32m:
			case X86_DEC64m:
			case X86_DEC8m:

			// ADC
			case X86_ADC16mi:
			case X86_ADC16mi8:
			case X86_ADC16mr:
			case X86_ADC32mi:
			case X86_ADC32mi8:
			case X86_ADC32mr:
			case X86_ADC64mi32:
			case X86_ADC64mi8:
			case X86_ADC64mr:
			case X86_ADC8mi:
			case X86_ADC8mr:

			// ADD
			case X86_ADD16mi:
			case X86_ADD16mi8:
			case X86_ADD16mr:
			case X86_ADD32mi:
			case X86_ADD32mi8:
			case X86_ADD32mr:
			case X86_ADD64mi32:
			case X86_ADD64mi8:
			case X86_ADD64mr:
			case X86_ADD8mi:
			case X86_ADD8mr:

			// AND
			case X86_AND16mi:
			case X86_AND16mi8:
			case X86_AND16mr:
			case X86_AND32mi:
			case X86_AND32mi8:
			case X86_AND32mr:
			case X86_AND64mi32:
			case X86_AND64mi8:
			case X86_AND64mr:
			case X86_AND8mi:
			case X86_AND8mr:

			// BTC
			case X86_BTC16mi8:
			case X86_BTC16mr:
			case X86_BTC32mi8:
			case X86_BTC32mr:
			case X86_BTC64mi8:
			case X86_BTC64mr:

			// BTR
			case X86_BTR16mi8:
			case X86_BTR16mr:
			case X86_BTR32mi8:
			case X86_BTR32mr:
			case X86_BTR64mi8:
			case X86_BTR64mr:

			// BTS
			case X86_BTS16mi8:
			case X86_BTS16mr:
			case X86_BTS32mi8:
			case X86_BTS32mr:
			case X86_BTS64mi8:
			case X86_BTS64mr:

			// CMPXCHG
			case X86_CMPXCHG16rm:
			case X86_CMPXCHG32rm:
			case X86_CMPXCHG64rm:
			case X86_CMPXCHG8rm:
			case X86_CMPXCHG8B:

			// INC
			case X86_INC16m:
			case X86_INC32m:
			case X86_INC64_16m:
			case X86_INC64_32m:
			case X86_INC64m:
			case X86_INC8m:

			// NEG
			case X86_NEG16m:
			case X86_NEG32m:
			case X86_NEG64m:
			case X86_NEG8m:

			// NOT
			case X86_NOT16m:
			case X86_NOT32m:
			case X86_NOT64m:
			case X86_NOT8m:

			// OR
			case X86_OR16mi:
			case X86_OR16mi8:
			case X86_OR16mr:
			case X86_OR32mi:
			case X86_OR32mi8:
			case X86_OR32mr:
			case X86_OR32mrLocked:
			case X86_OR64mi32:
			case X86_OR64mi8:
			case X86_OR64mr:
			case X86_OR8mi:
			case X86_OR8mr:

			// SBB
			case X86_SBB16mi:
			case X86_SBB16mi8:
			case X86_SBB16mr:
			case X86_SBB32mi:
			case X86_SBB32mi8:
			case X86_SBB32mr:
			case X86_SBB64mi32:
			case X86_SBB64mi8:
			case X86_SBB64mr:
			case X86_SBB8mi:
			case X86_SBB8mr:

			// SUB
			case X86_SUB16mi:
			case X86_SUB16mi8:
			case X86_SUB16mr:
			case X86_SUB32mi:
			case X86_SUB32mi8:
			case X86_SUB32mr:
			case X86_SUB64mi32:
			case X86_SUB64mi8:
			case X86_SUB64mr:
			case X86_SUB8mi:
			case X86_SUB8mr:

			// XADD
			case X86_XADD16rm:
			case X86_XADD32rm:
			case X86_XADD64rm:
			case X86_XADD8rm:

			// XCHG
			case X86_XCHG16rm:
			case X86_XCHG32rm:
			case X86_XCHG64rm:
			case X86_XCHG8rm:

			// XOR
			case X86_XOR16mi:
			case X86_XOR16mi8:
			case X86_XOR16mr:
			case X86_XOR32mi:
			case X86_XOR32mi8:
			case X86_XOR32mr:
			case X86_XOR64mi32:
			case X86_XOR64mi8:
			case X86_XOR64mr:
			case X86_XOR8mi:
			case X86_XOR8mr:

				// this instruction can be used with LOCK prefix
				return false;
		}
	}

	// no invalid prefixes
	return false;
}